

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O1

string * __thiscall
duckdb::ValidityMask::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ValidityMask *this,idx_t count)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  char cVar7;
  idx_t iVar8;
  string __str;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  cVar7 = '\x01';
  if (9 < count) {
    iVar8 = count;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (iVar8 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00dc9979;
      }
      if (iVar8 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00dc9979;
      }
      if (iVar8 < 10000) goto LAB_00dc9979;
      bVar1 = 99999 < iVar8;
      iVar8 = iVar8 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar1);
    cVar7 = cVar7 + '\x01';
  }
LAB_00dc9979:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar7);
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,count);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1df2e24);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (count != 0) {
    iVar8 = 0;
    do {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar8 = iVar8 + 1;
    } while (count != iVar8);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ValidityMask::ToString(idx_t count) const {
	string result = "Validity Mask (" + to_string(count) + ") [";
	for (idx_t i = 0; i < count; i++) {
		result += RowIsValid(i) ? "." : "X";
	}
	result += "]";
	return result;
}